

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh_asn1.cc
# Opt level: O1

int dh_param_cmp(EVP_PKEY *a,EVP_PKEY *b)

{
  DH *dh;
  DH *dh_00;
  int iVar1;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  uint uVar4;
  
  iVar1 = dh_param_missing(a);
  uVar4 = 0xfffffffe;
  if (iVar1 == 0) {
    iVar1 = dh_param_missing(b);
    if (iVar1 == 0) {
      dh = (DH *)a->pkey;
      dh_00 = (DH *)b->pkey;
      pBVar2 = (BIGNUM *)DH_get0_p(dh);
      pBVar3 = (BIGNUM *)DH_get0_p(dh_00);
      iVar1 = BN_cmp(pBVar2,pBVar3);
      uVar4 = 0;
      if (iVar1 == 0) {
        pBVar2 = (BIGNUM *)DH_get0_g(dh);
        pBVar3 = (BIGNUM *)DH_get0_g(dh_00);
        iVar1 = BN_cmp(pBVar2,pBVar3);
        uVar4 = (uint)(iVar1 == 0);
      }
    }
  }
  return uVar4;
}

Assistant:

static int dh_param_cmp(const EVP_PKEY *a, const EVP_PKEY *b) {
  if (dh_param_missing(a) || dh_param_missing(b)) {
    return -2;
  }

  // Matching OpenSSL, only compare p and g for PKCS#3-style Diffie-Hellman.
  // OpenSSL only checks q in X9.42-style Diffie-Hellman ("DHX").
  const DH *a_dh = reinterpret_cast<const DH *>(a->pkey);
  const DH *b_dh = reinterpret_cast<const DH *>(b->pkey);
  return BN_cmp(DH_get0_p(a_dh), DH_get0_p(b_dh)) == 0 &&
         BN_cmp(DH_get0_g(a_dh), DH_get0_g(b_dh)) == 0;
}